

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  Expression *this;
  SourceRange range;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange range_00;
  SourceRange sourceRange_01;
  string_view arg;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar1;
  LanguageVersion LVar2;
  int iVar3;
  DistConstraintListSyntax *pDVar4;
  Expression *expr;
  reference ppEVar5;
  SyntaxNode *this_00;
  DefaultDistItemSyntax *pDVar6;
  DistItemSyntax *pDVar7;
  ValueRangeExpression *this_01;
  Diagnostic *pDVar8;
  DistWeight *pDVar9;
  Type *args_3;
  undefined4 extraout_var;
  undefined8 in_RDX;
  EVP_PKEY_CTX *src;
  Compilation *in_RDI;
  DistExpression *result;
  Diagnostic *diag_1;
  DistWeightSyntax *weight_1;
  DistItem di;
  Diagnostic *diag;
  DistWeightSyntax *weight;
  DistItemBaseSyntax *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *__range2_1;
  size_t index;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  optional<slang::ast::DistExpression::DistWeight> defaultWeight;
  anon_class_16_2_80a99c9f createWeight;
  Expression *pred;
  bool bad;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  bool allowReal;
  DistItemBaseSyntax *item;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *__range2;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  iterator_base<slang::syntax::DistItemBaseSyntax_*> *in_stack_fffffffffffffaf8;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *in_stack_fffffffffffffb00;
  Compilation *compilation;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *in_stack_fffffffffffffb08;
  SourceLocation this_02;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffb10;
  SourceLocation this_03;
  Diagnostic *in_stack_fffffffffffffb18;
  SourceLocation in_stack_fffffffffffffb20;
  SourceLocation in_stack_fffffffffffffb28;
  anon_class_16_2_80a99c9f *in_stack_fffffffffffffb30;
  Diagnostic *in_stack_fffffffffffffb40;
  Type *in_stack_fffffffffffffb48;
  Diagnostic *in_stack_fffffffffffffb50;
  Compilation *args_4;
  Diagnostic *in_stack_fffffffffffffb68;
  Diagnostic *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  Type *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  ExpressionSyntax *in_stack_fffffffffffffcf0;
  pointer in_stack_fffffffffffffcf8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd00;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffd08;
  size_type local_200;
  SmallVectorBase<slang::ast::DistExpression::DistItem> local_1f8 [3];
  undefined8 local_148;
  byte *local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  SourceLocation local_128;
  SourceLocation SStack_120;
  undefined4 local_114;
  Expression *local_110;
  Compilation *local_108;
  SourceLocation SStack_100;
  byte local_f1;
  SmallVectorBase<const_slang::ast::Expression_*> local_f0 [2];
  byte local_a9;
  ExpressionSyntax *local_a8;
  SyntaxNode *local_a0;
  iterator local_98;
  iterator local_88;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *local_68;
  undefined8 local_20;
  Compilation *local_10;
  DistExpression *local_8;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0xa0858c);
  pDVar4 = not_null<slang::syntax::DistConstraintListSyntax_*>::operator->
                     ((not_null<slang::syntax::DistConstraintListSyntax_*> *)0xa0859d);
  local_68 = &pDVar4->items;
  local_88 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)0xa085c8);
  local_98 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::end
                       (in_stack_fffffffffffffb00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_a0 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                             *)0xa08676)->super_SyntaxNode;
    if (local_a0->kind == DistItem) {
      slang::syntax::SyntaxNode::as<slang::syntax::DistItemSyntax>(local_a0);
      local_a8 = not_null::operator_cast_to_ExpressionSyntax_
                           ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa086c8);
      SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
                ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                 in_stack_fffffffffffffb00,(ExpressionSyntax **)in_stack_fffffffffffffaf8);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                *)in_stack_fffffffffffffb00);
  }
  LVar2 = Compilation::languageVersion((Compilation *)0xa08737);
  local_a9 = 0 < (int)LVar2;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xa0875e);
  expr = (Expression *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa0878f);
  std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>_&>
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  this_03 = (SourceLocation)local_f0;
  expressions_00._M_extent._M_extent_value = in_stack_fffffffffffffd00._M_extent_value;
  expressions_00._M_ptr = in_stack_fffffffffffffcf8;
  bVar1 = Expression::bindMembershipExpressions
                    ((ASTContext *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                     (TokenKind)((ulong)pDVar4 >> 0x30),SUB81((ulong)pDVar4 >> 0x28,0),
                     SUB81((ulong)pDVar4 >> 0x20,0),SUB81((ulong)pDVar4 >> 0x18,0),
                     SUB81((ulong)pDVar4 >> 0x10,0),in_stack_fffffffffffffcf0,expressions_00,
                     in_stack_fffffffffffffd08);
  local_f1 = ~bVar1 & 1;
  ppEVar5 = SmallVectorBase<const_slang::ast::Expression_*>::operator[](local_f0,0);
  local_110 = *ppEVar5;
  compilation = local_108;
  this_02 = SStack_100;
  if (((local_a9 & 1) != 0) && ((local_f1 & 1) == 0)) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xa08875);
    bVar1 = Type::isNumeric((Type *)local_108);
    compilation = local_108;
    this_02 = SStack_100;
    if (!bVar1) {
      local_114 = 0x270007;
      local_128 = (local_110->sourceRange).startLoc;
      SStack_120 = (local_110->sourceRange).endLoc;
      sourceRange.endLoc = in_stack_fffffffffffffb28;
      sourceRange.startLoc = in_stack_fffffffffffffb20;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb18,
                          SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0),sourceRange);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa08904);
      ast::operator<<(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      local_138 = sv((char *)local_108,(size_t)expr);
      arg._M_str = (char *)in_stack_fffffffffffffb50;
      arg._M_len = (size_t)in_stack_fffffffffffffb48;
      Diagnostic::operator<<(in_stack_fffffffffffffb40,arg);
      local_f1 = 1;
      compilation = local_108;
      this_02 = SStack_100;
    }
  }
  local_148 = local_20;
  local_140 = &local_f1;
  std::optional<slang::ast::DistExpression::DistWeight>::optional
            ((optional<slang::ast::DistExpression::DistWeight> *)0xa089bf);
  SmallVector<slang::ast::DistExpression::DistItem,_4UL>::SmallVector
            ((SmallVector<slang::ast::DistExpression::DistItem,_4UL> *)0xa089cc);
  local_200 = 1;
  not_null<slang::syntax::DistConstraintListSyntax_*>::operator->
            ((not_null<slang::syntax::DistConstraintListSyntax_*> *)0xa089e9);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)0xa08a14);
  slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::end
            ((SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *)compilation);
  do {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
                      ((self_type *)compilation,
                       (iterator_base<slang::syntax::DistItemBaseSyntax_*> *)expr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      args_4 = local_10;
      args_3 = Compilation::getVoidType(local_10);
      iVar3 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                        (local_1f8,(EVP_PKEY_CTX *)local_10,src);
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)CONCAT44(extraout_var,iVar3));
      local_8 = BumpAllocator::
                emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
                          ((BumpAllocator *)in_stack_fffffffffffffb80,
                           (Type *)CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
                           (Expression *)in_stack_fffffffffffffb70,
                           (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)
                           in_stack_fffffffffffffb68,
                           (optional<slang::ast::DistExpression::DistWeight> *)args_3,
                           (SourceRange *)args_4);
      if ((local_f1 & 1) != 0) {
        local_8 = (DistExpression *)Expression::badExpr(compilation,expr);
      }
      SmallVector<slang::ast::DistExpression::DistItem,_4UL>::~SmallVector
                ((SmallVector<slang::ast::DistExpression::DistItem,_4UL> *)0xa0909b);
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0xa090a8);
      SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0xa090b5);
      return &local_8->super_Expression;
    }
    this_00 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
               ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                            *)0xa08ac2)->super_SyntaxNode;
    if (this_00->kind == DistItem) {
      ppEVar5 = SmallVectorBase<const_slang::ast::Expression_*>::operator[](local_f0,local_200);
      this = *ppEVar5;
      std::optional<slang::ast::DistExpression::DistWeight>::optional
                ((optional<slang::ast::DistExpression::DistWeight> *)0xa08d1e);
      pDVar7 = slang::syntax::SyntaxNode::as<slang::syntax::DistItemSyntax>(this_00);
      if (pDVar7->weight != (DistWeightSyntax *)0x0) {
        fromSyntax::anon_class_16_2_80a99c9f::operator()
                  (in_stack_fffffffffffffb30,(DistWeightSyntax *)in_stack_fffffffffffffb28);
        std::optional<slang::ast::DistExpression::DistWeight>::operator=
                  ((optional<slang::ast::DistExpression::DistWeight> *)this_03,(DistWeight *)this_02
                  );
      }
      if (this->kind == ValueRange) {
        this_01 = Expression::as<slang::ast::ValueRangeExpression>(this);
        ValueRangeExpression::left(this_01);
        in_stack_fffffffffffffb80 =
             not_null<const_slang::ast::Type_*>::operator->
                       ((not_null<const_slang::ast::Type_*> *)0xa08e01);
        in_stack_fffffffffffffb7f = Type::isFloating((Type *)0xa08e18);
        if ((bool)in_stack_fffffffffffffb7f) {
          bVar1 = std::optional::operator_cast_to_bool
                            ((optional<slang::ast::DistExpression::DistWeight> *)0xa08e42);
          if (bVar1) {
            pDVar9 = std::optional<slang::ast::DistExpression::DistWeight>::operator->
                               ((optional<slang::ast::DistExpression::DistWeight> *)0xa08e59);
            if (pDVar9->kind == PerRange) goto LAB_00a08f32;
          }
          sourceRange_01.endLoc = in_stack_fffffffffffffb28;
          sourceRange_01.startLoc = in_stack_fffffffffffffb20;
          pDVar8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb18,
                                       SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0),
                                       sourceRange_01);
          in_stack_fffffffffffffb70 = pDVar8;
          bVar1 = std::optional::operator_cast_to_bool
                            ((optional<slang::ast::DistExpression::DistWeight> *)0xa08eca);
          if (bVar1) {
            pDVar9 = std::optional<slang::ast::DistExpression::DistWeight>::operator->
                               ((optional<slang::ast::DistExpression::DistWeight> *)0xa08ee1);
            if (pDVar9->expr != (Expression *)0x0) {
              std::optional<slang::ast::DistExpression::DistWeight>::operator->
                        ((optional<slang::ast::DistExpression::DistWeight> *)0xa08f02);
              range.endLoc = this_03;
              range.startLoc = this_02;
              Diagnostic::operator<<((Diagnostic *)compilation,range);
              in_stack_fffffffffffffb68 = pDVar8;
            }
          }
        }
      }
LAB_00a08f32:
      SmallVectorBase<slang::ast::DistExpression::DistItem>::
      emplace_back<slang::ast::DistExpression::DistItem&>
                ((SmallVectorBase<slang::ast::DistExpression::DistItem> *)this_02,
                 (DistItem *)compilation);
      local_200 = local_200 + 1;
    }
    else {
      pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultDistItemSyntax>(this_00);
      if (pDVar6->weight != (DistWeightSyntax *)0x0) {
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional<slang::ast::DistExpression::DistWeight> *)0xa08b37);
        if (bVar1) {
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffb50);
          sourceRange_00.endLoc = in_stack_fffffffffffffb28;
          sourceRange_00.startLoc = in_stack_fffffffffffffb20;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb18,
                              SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0),sourceRange_00);
          std::optional<slang::ast::DistExpression::DistWeight>::operator->
                    ((optional<slang::ast::DistExpression::DistWeight> *)0xa08c00);
          range_00.endLoc = in_stack_fffffffffffffb28;
          range_00.startLoc = in_stack_fffffffffffffb20;
          Diagnostic::addNote(in_stack_fffffffffffffb18,
                              SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0),range_00);
        }
        else {
          fromSyntax::anon_class_16_2_80a99c9f::operator()
                    (in_stack_fffffffffffffb30,(DistWeightSyntax *)in_stack_fffffffffffffb28);
          std::optional<slang::ast::DistExpression::DistWeight>::operator=
                    ((optional<slang::ast::DistExpression::DistWeight> *)this_03,
                     (DistWeight *)this_02);
        }
      }
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::iterator_base<slang::syntax::DistItemBaseSyntax_*>,_false>
                *)compilation);
  } while( true );
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items) {
        if (item->kind == SyntaxKind::DistItem)
            expressions.push_back(item->as<DistItemSyntax>().range);
    }

    const bool allowReal = comp.languageVersion() >= LanguageVersion::v1800_2023;

    SmallVector<const Expression*> bound;
    bool bad = !bindMembershipExpressions(
        context, TokenKind::DistKeyword, /* requireIntegral */ !allowReal,
        /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
        /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto& pred = *bound[0];
    if (allowReal && !bad) {
        if (!pred.type->isNumeric()) {
            context.addDiag(diag::BadSetMembershipType, pred.sourceRange) << *pred.type << "dist"sv;
            bad = true;
        }
    }

    auto createWeight = [&](const DistWeightSyntax& weight) {
        auto weightKind = DistWeight::PerValue;
        if (weight.op.kind == TokenKind::ColonSlash ||
            (weight.op.kind == TokenKind::Colon && weight.extraOp.kind == TokenKind::Slash)) {
            weightKind = DistWeight::PerRange;
        }

        auto& weightExpr = Expression::bind(*weight.expr, context);
        if (!context.requireIntegral(weightExpr))
            bad = true;

        return DistWeight{weightKind, &weightExpr};
    };

    std::optional<DistWeight> defaultWeight;
    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        if (item->kind != SyntaxKind::DistItem) {
            if (auto weight = item->as<DefaultDistItemSyntax>().weight) {
                if (defaultWeight) {
                    auto& diag = context.addDiag(diag::MultipleDefaultDistWeight,
                                                 item->sourceRange());
                    diag.addNote(diag::NotePreviousUsage, defaultWeight->expr->sourceRange);
                }
                else {
                    defaultWeight = createWeight(*weight);
                }
            }
            continue;
        }

        DistItem di{*bound[index++], {}};
        if (auto weight = item->as<DistItemSyntax>().weight)
            di.weight = createWeight(*weight);

        if (di.value.kind == ExpressionKind::ValueRange &&
            di.value.as<ValueRangeExpression>().left().type->isFloating() &&
            (!di.weight || di.weight->kind != DistWeight::PerRange)) {
            auto& diag = context.addDiag(diag::DistRealRangeWeight, di.value.sourceRange);
            if (di.weight && di.weight->expr)
                diag << di.weight->expr->sourceRange;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), pred, items.copy(comp),
                                               defaultWeight, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}